

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

QHttp2Connection *
QHttp2Connection::createDirectServerConnection(QIODevice *socket,QHttp2Configuration *config)

{
  unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *this;
  pointer pQVar1;
  long in_FS_OFFSET;
  unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> connection;
  pointer in_stack_ffffffffffffffa8;
  QIODevice *in_stack_ffffffffffffffb8;
  QHttp2Connection *in_stack_ffffffffffffffc0;
  QHttp2Connection *this_00;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this = (unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)operator_new(0x2b8)
  ;
  QHttp2Connection(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::unique_ptr<QHttp2Connection,std::default_delete<QHttp2Connection>>::
  unique_ptr<std::default_delete<QHttp2Connection>,void>(this,in_stack_ffffffffffffffa8);
  pQVar1 = std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::operator->
                     ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)
                      0x2b5489);
  this_00 = (QHttp2Connection *)&stack0xffffffffffffffe8;
  QHttp2Configuration::QHttp2Configuration
            ((QHttp2Configuration *)this,(QHttp2Configuration *)in_stack_ffffffffffffffa8);
  setH2Configuration(this_00,(QHttp2Configuration *)pQVar1);
  QHttp2Configuration::~QHttp2Configuration((QHttp2Configuration *)0x2b54bb);
  pQVar1 = std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::operator->
                     ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)
                      0x2b54c5);
  pQVar1->m_connectionType = Server;
  pQVar1 = std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::operator->
                     ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)
                      0x2b54d6);
  pQVar1->m_nextStreamID = 2;
  pQVar1 = std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::operator->
                     ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)
                      0x2b54ea);
  pQVar1->m_waitingForClientPreface = true;
  pQVar1 = std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::release
                     ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)
                      0x2b54fb);
  std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::~unique_ptr(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Connection *QHttp2Connection::createDirectServerConnection(QIODevice *socket,
                                                                 const QHttp2Configuration &config)
{
    auto connection = std::unique_ptr<QHttp2Connection>(new QHttp2Connection(socket));
    connection->setH2Configuration(config);
    connection->m_connectionType = QHttp2Connection::Type::Server;

    connection->m_nextStreamID = 2; // server-initiated streams must be even

    connection->m_waitingForClientPreface = true;

    return connection.release();
}